

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

XMLNode __thiscall XMLParser::XMLNode::deepCopy(XMLNode *this)

{
  XMLNodeData *pXVar1;
  char *pcVar2;
  XMLAttribute *pXVar3;
  int *__dest;
  char **ppcVar4;
  XMLClear *pXVar5;
  XMLNode *pXVar6;
  long *in_RSI;
  long lVar7;
  size_t sVar8;
  long lVar9;
  XMLNode XStack_38;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    XMLNode(this,(XMLNode *)&emptyXMLNode);
  }
  else {
    pcVar2 = stringDup(*(char **)*in_RSI,-1);
    XMLNode(this,(XMLNodeData *)0x0,pcVar2,*(char *)(*in_RSI + 0x18));
    pXVar1 = this->d;
    lVar7 = (long)*(int *)(*in_RSI + 0x14);
    if (lVar7 != 0) {
      pXVar1->nAttribute = *(int *)(*in_RSI + 0x14);
      sVar8 = lVar7 << 4;
      pXVar3 = (XMLAttribute *)malloc(sVar8);
      pXVar1->pAttribute = pXVar3;
      do {
        pcVar2 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -0x10 + sVar8),-1);
        *(char **)((long)&pXVar1->pAttribute[-1].lpszName + sVar8) = pcVar2;
        pcVar2 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -8 + sVar8),-1);
        *(char **)((long)pXVar1->pAttribute + (sVar8 - 8)) = pcVar2;
        sVar8 = sVar8 - 0x10;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    lVar7 = *in_RSI;
    if (*(long *)(lVar7 + 0x48) != 0) {
      sVar8 = (size_t)((*(int *)(lVar7 + 0xc) + *(int *)(lVar7 + 8) + *(int *)(lVar7 + 0x10)) * 4);
      __dest = (int *)malloc(sVar8);
      pXVar1->pOrder = __dest;
      memcpy(__dest,*(void **)(lVar7 + 0x48),sVar8);
    }
    lVar9 = (long)*(int *)(lVar7 + 0xc);
    if (lVar9 != 0) {
      pXVar1->nText = *(int *)(lVar7 + 0xc);
      ppcVar4 = (char **)malloc(lVar9 * 8);
      pXVar1->pText = ppcVar4;
      do {
        pcVar2 = stringDup(*(char **)(*(long *)(*in_RSI + 0x30) + -8 + lVar9 * 8),-1);
        pXVar1->pText[lVar9 + -1] = pcVar2;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    lVar7 = (long)*(int *)(*in_RSI + 0x10);
    if (lVar7 != 0) {
      pXVar1->nClear = *(int *)(*in_RSI + 0x10);
      sVar8 = lVar7 * 0x18;
      pXVar5 = (XMLClear *)malloc(sVar8);
      pXVar1->pClear = pXVar5;
      do {
        lVar9 = *(long *)(*in_RSI + 0x38);
        pXVar5 = pXVar1->pClear;
        *(undefined8 *)((long)pXVar5 + (sVar8 - 8)) = *(undefined8 *)(lVar9 + -8 + sVar8);
        *(undefined8 *)((long)pXVar5 + (sVar8 - 0x10)) = *(undefined8 *)(lVar9 + -0x10 + sVar8);
        pcVar2 = stringDup(*(char **)(lVar9 + -0x18 + sVar8),-1);
        *(char **)((long)&pXVar1->pClear[-1].lpszValue + sVar8) = pcVar2;
        sVar8 = sVar8 - 0x18;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    lVar7 = (long)*(int *)(*in_RSI + 8);
    if (lVar7 != 0) {
      pXVar1->nChild = *(int *)(*in_RSI + 8);
      pXVar6 = (XMLNode *)malloc(lVar7 * 8);
      pXVar1->pChild = pXVar6;
      lVar9 = -lVar7;
      lVar7 = lVar7 * 8;
      do {
        *(undefined8 *)((long)&pXVar1->pChild[-1].d + lVar7) = 0;
        deepCopy(&XStack_38);
        operator=((XMLNode *)((long)&pXVar1->pChild[-1].d + lVar7),&XStack_38);
        ~XMLNode(&XStack_38);
        *(XMLNodeData **)(*(long *)((long)&pXVar1->pChild[-1].d + lVar7) + 0x20) = pXVar1;
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + -8;
      } while (lVar9 != 0);
    }
  }
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::deepCopy() const
    {
        if(!d)
            return XMLNode::emptyXMLNode;
        XMLNode x(NULL, stringDup(d->lpszName), d->isDeclaration);
        XMLNodeData * p = x.d;
        int n = d->nAttribute;
        if(n)
        {
            p->nAttribute = n;
            p->pAttribute = (XMLAttribute *)malloc(n * sizeof(XMLAttribute));
            while(n--)
            {
                p->pAttribute[n].lpszName = stringDup(d->pAttribute[n].lpszName);
                p->pAttribute[n].lpszValue = stringDup(d->pAttribute[n].lpszValue);
            }
        }
        if(d->pOrder)
        {
            n = (d->nChild + d->nText + d->nClear) * sizeof(int);
            p->pOrder = (int *)malloc(n);
            memcpy(p->pOrder, d->pOrder, n);
        }
        n = d->nText;
        if(n)
        {
            p->nText = n;
            p->pText = (XMLCSTR *)malloc(n * sizeof(XMLCSTR));
            while(n--)
                p->pText[n] = stringDup(d->pText[n]);
        }
        n = d->nClear;
        if(n)
        {
            p->nClear = n;
            p->pClear = (XMLClear *)malloc(n * sizeof(XMLClear));
            while(n--)
            {
                p->pClear[n].lpszCloseTag = d->pClear[n].lpszCloseTag;
                p->pClear[n].lpszOpenTag = d->pClear[n].lpszOpenTag;
                p->pClear[n].lpszValue = stringDup(d->pClear[n].lpszValue);
            }
        }
        n = d->nChild;
        if(n)
        {
            p->nChild = n;
            p->pChild = (XMLNode *)malloc(n * sizeof(XMLNode));
            while(n--)
            {
                p->pChild[n].d = NULL;
                p->pChild[n] = d->pChild[n].deepCopy();
                p->pChild[n].d->pParent = p;
            }
        }
        return x;
    }